

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_filter_test.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  undefined4 *puVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  copy_filter flt;
  ostringstream oss;
  ostringstream ss;
  string local_510 [32];
  undefined1 *local_4f0 [2];
  undefined1 local_4e0 [448];
  undefined1 *local_320 [2];
  undefined1 local_310 [360];
  long local_1a8;
  string local_1a0 [368];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Normal flow",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"a",1);
  cppcms::copy_filter::copy_filter((copy_filter *)local_4f0,(ostream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"bc",2);
  cppcms::copy_filter::detach_abi_cxx11_();
  iVar1 = std::__cxx11::string::compare((char *)local_320);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0]);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_320,0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," flt.detach()==\"bc\"",0x13);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_510);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"d",1);
  cppcms::copy_filter::~copy_filter((copy_filter *)local_4f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"e",1);
  std::__cxx11::stringbuf::str();
  iVar1 = std::__cxx11::string::compare((char *)local_4f0);
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0]);
  }
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- With Flush",0xc);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ios::clear((int)(ostream *)&local_1a8 + (int)*(undefined8 *)(local_1a8 + -0x18));
    local_4f0[0] = local_4e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"");
    std::__cxx11::stringbuf::str(local_1a0);
    if (local_4f0[0] != local_4e0) {
      operator_delete(local_4f0[0]);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"a",1);
    cppcms::copy_filter::copy_filter((copy_filter *)local_4f0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"b",1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"c",1);
    cppcms::copy_filter::detach_abi_cxx11_();
    iVar1 = std::__cxx11::string::compare((char *)local_320);
    if (local_320[0] != local_310) {
      operator_delete(local_320[0]);
    }
    if (iVar1 == 0) {
      cppcms::copy_filter::~copy_filter((copy_filter *)local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"d",1);
      std::__cxx11::stringbuf::str();
      iVar1 = std::__cxx11::string::compare((char *)local_4f0);
      if (local_4f0[0] != local_4e0) {
        operator_delete(local_4f0[0]);
      }
      if (iVar1 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"- With throw and flush",0x16);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::ios::clear((int)(ostream *)&local_1a8 + (int)*(undefined8 *)(local_1a8 + -0x18));
        local_4f0[0] = local_4e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"");
        std::__cxx11::stringbuf::str(local_1a0);
        if (local_4f0[0] != local_4e0) {
          operator_delete(local_4f0[0]);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"a",1);
        cppcms::copy_filter::copy_filter((copy_filter *)local_4f0,(ostream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"b",1);
        std::ostream::flush();
        puVar2 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar2 = 1;
        __cxa_throw(puVar2,&int::typeinfo,0);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_4f0,0x27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ss.str()==\"abcd\"",0x11);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)local_320);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_320,0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," flt.detach()==\"bc\"",0x13);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_510);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4f0,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/copy_filter_test.cpp"
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_4f0,0x1a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ss.str()==\"abcde\"",0x12);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,(string *)local_320);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		std::cout << "- Normal flow" << std::endl;
		std::ostringstream ss;
		ss << "a";
		{
			cppcms::copy_filter flt(ss);
			ss << "bc";
			TEST(flt.detach()=="bc");
			ss << "d";
		}
		ss << "e";
		TEST(ss.str()=="abcde");
		std::cout << "- With Flush" << std::endl;
		ss.clear();
		ss.str("");
		ss << "a";
		{
			cppcms::copy_filter flt(ss);
			ss << "b";
			ss << std::flush;
			ss << "c";
			TEST(flt.detach()=="bc");
		}
		ss << "d";
		TEST(ss.str()=="abcd");
		std::cout << "- With throw and flush" << std::endl;
		ss.clear();
		ss.str("");
		ss << "a";
		try {
			cppcms::copy_filter flt(ss);
			ss << "b";
			ss << std::flush;
			throw int(1);
		}
		catch(int x){}
		ss << "c";
		TEST(ss.str()=="abc");
		std::cout << "- With throw and no flush" << std::endl;
		ss.clear();
		ss.str("");
		ss << "a";
		try {
			cppcms::copy_filter flt(ss);
			ss << "b";
			throw int(1);
		}
		catch(int x){}
		ss << "c";
		TEST(ss.str()=="ac");

	}
	catch(std::exception const &e) {
		std::cerr << "Fail:" << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;

}